

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

optional<tinyusdz::Animatable<bool>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<bool>
          (optional<tinyusdz::Animatable<bool>_> *__return_storage_ptr__,PrimVar *var)

{
  double t;
  bool bVar1;
  TimeSamples *pTVar2;
  Sample *pSVar3;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this;
  value_type *pvVar4;
  undefined1 local_64 [2];
  optional<bool> local_62 [4];
  optional<bool> pv_1;
  Sample *s;
  size_t i;
  uint local_48;
  optional<bool> pv;
  bool ok;
  undefined1 local_40 [8];
  Animatable<bool> dst;
  PrimVar *var_local;
  
  dst._ts._24_8_ = var;
  Animatable<bool>::Animatable((Animatable<bool> *)local_40);
  bVar1 = primvar::PrimVar::is_valid((PrimVar *)dst._ts._24_8_);
  if (bVar1) {
    i._7_1_ = 0;
    bVar1 = primvar::PrimVar::has_value((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      primvar::PrimVar::get_value<bool>((PrimVar *)((long)&i + 3));
      nonstd::optional_lite::optional<bool>::optional<bool,_0>
                ((optional<bool> *)((long)&i + 5),(optional<bool> *)((long)&i + 3));
      nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)((long)&i + 3));
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)((long)&i + 5));
      if (bVar1) {
        pvVar4 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)((long)&i + 5));
        Animatable<bool>::set_default((Animatable<bool> *)local_40,pvVar4);
        i._7_1_ = 1;
      }
      nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)((long)&i + 5));
    }
    bVar1 = primvar::PrimVar::has_timesamples((PrimVar *)dst._ts._24_8_);
    if (bVar1) {
      s = (Sample *)0x0;
      while( true ) {
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        pSVar3 = (Sample *)tinyusdz::value::TimeSamples::size(pTVar2);
        if (pSVar3 <= s) break;
        pTVar2 = primvar::PrimVar::ts_raw((PrimVar *)dst._ts._24_8_);
        this = tinyusdz::value::TimeSamples::get_samples(pTVar2);
        register0x00000000 =
             ::std::
             vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ::operator[]((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)this,(size_type)s);
        if ((((const_reference)register0x00000000)->blocked & 1U) == 0) {
          tinyusdz::value::Value::get_value<bool>
                    ((Value *)local_64,(bool)((char)register0x00000000 + '\b'));
          nonstd::optional_lite::optional<bool>::optional<bool,_0>
                    ((optional<bool> *)(local_64 + 2),(optional<bool> *)local_64);
          nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)local_64);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(local_64 + 2))
          ;
          if (bVar1) {
            t = *(double *)stack0xffffffffffffffa0;
            pvVar4 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(local_64 + 2));
            Animatable<bool>::add_sample((Animatable<bool> *)local_40,t,pvVar4);
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::optional
                      (__return_storage_ptr__);
          }
          local_48 = (uint)!bVar1;
          nonstd::optional_lite::optional<bool>::~optional((optional<bool> *)(local_64 + 2));
          if (local_48 != 0) goto LAB_002d6de5;
        }
        else {
          Animatable<bool>::add_blocked_sample
                    ((Animatable<bool> *)local_40,((const_reference)register0x00000000)->t);
        }
        s = (Sample *)((long)&s->t + 1);
      }
      i._7_1_ = 1;
    }
    if ((i._7_1_ & 1) == 0) {
      nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::optional(__return_storage_ptr__)
      ;
      local_48 = 1;
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::
      optional<tinyusdz::Animatable<bool>,_0>(__return_storage_ptr__,(Animatable<bool> *)local_40);
      local_48 = 1;
    }
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::optional(__return_storage_ptr__);
    local_48 = 1;
  }
LAB_002d6de5:
  Animatable<bool>::~Animatable((Animatable<bool> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}